

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::
reject<QtPromise::QPromiseUndefinedException>
          (PromiseDataBase<QString,_void_(const_QString_&)> *this,QPromiseUndefinedException *error)

{
  exception_ptr eStack_18;
  
  PromiseError::PromiseError<QtPromise::QPromiseUndefinedException>
            ((PromiseError *)&eStack_18,error);
  std::__exception_ptr::exception_ptr::operator=(&(this->m_error).m_data,&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  setSettled(this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }